

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

void __thiscall itis::AVLTree<short>::erase(AVLTree<short> *this,short value)

{
  AVLTreeNode<short> *pAVar1;
  reference pppAVar2;
  bool bVar3;
  vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> local_90;
  AVLTreeNode<short> *local_78;
  AVLTreeNode<short> *suc;
  AVLTreeNode<short> *tmp;
  AVLTreeNode<short> *toRemove_1;
  AVLTreeNode<short> **successor;
  AVLTreeNode<short> *toRemove;
  size_t index;
  undefined1 local_38 [8];
  vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> path;
  AVLTreeNode<short> **indirect;
  short value_local;
  AVLTree<short> *this_local;
  
  path.super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->root;
  std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::vector
            ((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *)
             local_38);
  while( true ) {
    bVar3 = false;
    if (*path.
         super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage != (AVLTreeNode<short> **)0x0) {
      bVar3 = *(short *)(*path.
                          super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) != value;
    }
    if (!bVar3) break;
    std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
    push_back((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *)
              local_38,(value_type *)
                       &path.
                        super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (value < *(short *)(*path.
                            super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 2)) {
      path.
      super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(*path.
                      super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    else {
      path.
      super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)*path.
                     super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  if (*path.
       super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage == (AVLTreeNode<short> **)0x0) {
    index._0_4_ = 1;
  }
  else {
    std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
    push_back((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *)
              local_38,(value_type *)
                       &path.
                        super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    toRemove = (AVLTreeNode<short> *)
               std::
               vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
               size((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                     *)local_38);
    if (((*path.
           super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage)[1] == (AVLTreeNode<short> *)0x0) &&
       (**path.
          super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (AVLTreeNode<short> *)0x0)) {
      if (*path.
           super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (AVLTreeNode<short> **)0x0) {
        operator_delete(*path.
                         super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0x20);
      }
      *path.
       super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (AVLTreeNode<short> **)0x0;
      std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
      pop_back((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *)
               local_38);
    }
    else if (**path.
               super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == (AVLTreeNode<short> *)0x0) {
      successor = *path.
                   super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *path.
       super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &(*path.
              super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)[1]->right;
      if (successor != (AVLTreeNode<short> **)0x0) {
        operator_delete(successor,0x20);
      }
      std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
      pop_back((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *)
               local_38);
    }
    else {
      toRemove_1 = (AVLTreeNode<short> *)
                   *path.
                    super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      while (toRemove_1->right->left != (AVLTreeNode<short> *)0x0) {
        std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::
        push_back((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                   *)local_38,(value_type *)&toRemove_1);
        toRemove_1 = (AVLTreeNode<short> *)&toRemove_1->right->left;
      }
      if (toRemove_1->right ==
          **path.
            super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        toRemove_1->right->left =
             (*path.
               super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)[1];
        tmp = (AVLTreeNode<short> *)
              *path.
               super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *path.
         super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage = &toRemove_1->right->right;
        if (tmp != (AVLTreeNode<short> *)0x0) {
          operator_delete(tmp,0x20);
        }
      }
      else {
        pppAVar2 = std::
                   vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                   ::back((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                           *)local_38);
        suc = **pppAVar2;
        local_78 = toRemove_1->right;
        suc->left = toRemove_1->right->right;
        local_78->left =
             (*path.
               super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)[1];
        local_78->right =
             **path.
               super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (*path.
             super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != (AVLTreeNode<short> **)0x0) {
          operator_delete(*path.
                           super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0x20);
        }
        pAVar1 = local_78;
        *path.
         super__Vector_base<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_78->right;
        pppAVar2 = std::
                   vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                   ::operator[]((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>
                                 *)local_38,(size_type)toRemove);
        *pppAVar2 = &pAVar1->right;
      }
    }
    std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::vector
              (&local_90,
               (vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *)
               local_38);
    balance(this,&local_90);
    std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::~vector
              (&local_90);
    this->_size = this->_size + -1;
    index._0_4_ = 0;
  }
  std::vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_>::~vector
            ((vector<itis::AVLTreeNode<short>_**,_std::allocator<itis::AVLTreeNode<short>_**>_> *)
             local_38);
  return;
}

Assistant:

void AVLTree<T>::erase(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr and (*indirect)->value != value) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    if (*indirect == nullptr) {  // the value does not exist in tree
      return;                    // may be raising an Exception is more elegant
    }

    path.push_back(indirect);

    std::size_t index = path.size();

    if ((*indirect)->left == nullptr and (*indirect)->right == nullptr) {  // the node is leaf
      delete *indirect;                                                    // just delete node
      *indirect = nullptr;
      path.pop_back();  // pop the deleted node from path
    }

    else if ((*indirect)->right == nullptr) {  // only left child exists
      AVLTreeNode<T> *toRemove = *indirect;

      (*indirect) = (*indirect)->left;
      delete toRemove;

      path.pop_back();
    }

    else {  // right child exists
      AVLTreeNode<T> **successor = &((*indirect)->right);

      while ((*successor)->left != nullptr) {
        path.push_back(successor);
        successor = &((*successor)->left);
      }

      if (*successor == (*indirect)->right) {
        (*successor)->left = (*indirect)->left;

        AVLTreeNode<T> *toRemove = *indirect;
        *indirect = *successor;
        delete toRemove;
      }

      else {
        AVLTreeNode<T> *tmp = *path.back();
        AVLTreeNode<T> *suc = *successor;

        tmp->left = (*successor)->right;
        suc->left = (*indirect)->left;
        suc->right = (*indirect)->right;

        delete *indirect;
        *indirect = suc;
        path[index] = &(suc->right);
      }
    }

    balance(path);
    _size--;
  }